

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

int av1_is_leaf_split_partition(AV1_COMMON *cm,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  ulong uVar1;
  BLOCK_SIZE BVar2;
  int iVar3;
  undefined7 in_register_00000009;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  iVar3 = (int)CONCAT71(in_register_00000009,bsize);
  uVar6 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  switch(uVar6) {
  case 0:
    bVar8 = false;
    uVar1 = uVar6;
    goto LAB_001a755f;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001a751d_caseD_1:
    bVar8 = true;
    uVar1 = 6;
    goto LAB_001a755f;
  case 3:
    uVar1 = 1;
    break;
  case 6:
    uVar1 = 2;
    break;
  case 9:
    uVar1 = 3;
    break;
  default:
    if (iVar3 == 0xc) {
      uVar1 = 4;
    }
    else {
      if (iVar3 != 0xf) goto switchD_001a751d_caseD_1;
      uVar1 = 5;
    }
  }
  bVar8 = false;
LAB_001a755f:
  BVar2 = BLOCK_INVALID;
  if (!bVar8) {
    BVar2 = subsize_lookup[3][uVar1];
  }
  iVar3 = (cm->mi_params).mi_rows;
  uVar7 = 0;
  if (mi_row < iVar3) {
    uVar7 = 0;
    bVar8 = false;
    iVar4 = mi_row;
    do {
      uVar5 = 0;
      if ((uVar7 & 1) != 0) {
        uVar5 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                       [uVar6] >> 1);
      }
      if (((cm->mi_params).mi_cols <= (int)(uVar5 + mi_col)) ||
         (((BVar2 != BLOCK_8X8 &&
           ((cm->mi_params).mi_grid_base[(int)(iVar4 * (cm->mi_params).mi_stride + uVar5 + mi_col)]
            ->bsize != BVar2)) || (bVar8 = 2 < uVar7, uVar7 == 3)))) break;
      uVar7 = uVar7 + 1;
      iVar4 = (uVar7 >> 1) *
              (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [uVar6] >> 1) + mi_row;
    } while (iVar4 < iVar3);
    uVar7 = (uint)bVar8;
  }
  return uVar7;
}

Assistant:

int av1_is_leaf_split_partition(AV1_COMMON *cm, int mi_row, int mi_col,
                                BLOCK_SIZE bsize) {
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  assert(bsize >= BLOCK_8X8);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);

  for (int i = 0; i < 4; i++) {
    int x_idx = (i & 1) * hbs;
    int y_idx = (i >> 1) * hbs;
    if ((mi_row + y_idx >= cm->mi_params.mi_rows) ||
        (mi_col + x_idx >= cm->mi_params.mi_cols))
      return 0;
    if (get_partition(cm, mi_row + y_idx, mi_col + x_idx, subsize) !=
            PARTITION_NONE &&
        subsize != BLOCK_8X8)
      return 0;
  }
  return 1;
}